

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# winingstate_test.cpp
# Opt level: O0

void __thiscall
TEST_WiningStateTest_RobbingQuad_Test::testBody(TEST_WiningStateTest_RobbingQuad_Test *this)

{
  size_type sVar1;
  size_type sVar2;
  UtestShell *pUVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long in_stack_fffffffffffffe48;
  undefined4 uVar7;
  undefined8 uVar6;
  NormalTestTerminator *this_00;
  int value;
  NormalTestTerminator local_110;
  NormalTestTerminator local_108;
  SimpleString local_100;
  SimpleString local_f8;
  NormalTestTerminator local_f0;
  NormalTestTerminator local_e8;
  key_type local_dc;
  SimpleString local_d8;
  SimpleString local_d0;
  key_type local_c4 [6];
  key_type local_ac;
  undefined1 local_a8 [8];
  DoublingFactorReport r;
  WinByDiscardSituation local_13;
  TEST_WiningStateTest_RobbingQuad_Test *pTStack_10;
  WinByDiscardSituation situation;
  TEST_WiningStateTest_RobbingQuad_Test *this_local;
  
  pTStack_10 = this;
  TEST_GROUP_CppUTestGroupWiningStateTest::addNoWiningHand
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,false);
  mahjong::WinByDiscardSituation::WinByDiscardSituation(&local_13);
  local_13.is_robbing_quad = true;
  r.doubling_factor._2_1_ = true;
  r.doubling_factor._0_1_ = local_13.is_one_shot;
  r.doubling_factor._1_1_ = local_13.is_last_discard;
  TEST_GROUP_CppUTestGroupWiningStateTest::winByDiscard
            (&this->super_TEST_GROUP_CppUTestGroupWiningStateTest,r.doubling_factor._0_3_);
  mahjong::DoubligFactorCounter::report
            ((DoublingFactorReport *)local_a8,
             &(this->super_TEST_GROUP_CppUTestGroupWiningStateTest).c);
  local_ac = RobbingQuad;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,&local_ac);
  if (sVar1 == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_f0.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    this_00 = &local_f0;
    NormalTestTerminator::NormalTestTerminator(this_00);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xad);
    value = (int)((ulong)this_00 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e05de);
  }
  else {
    local_c4[1] = 7;
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_c4 + 1);
    local_c4[0] = RobbingQuad;
    sVar2 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
                   *)&r.wining_hand.last_tile,local_c4);
    if (sVar1 != sVar2) {
      pUVar3 = UtestShell::getCurrent();
      (*pUVar3->_vptr_UtestShell[0x1b])
                (pUVar3,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
                 ,0xad);
    }
    pUVar3 = UtestShell::getCurrent();
    StringFrom((int)(in_stack_fffffffffffffe48 >> 0x20));
    pcVar4 = SimpleString::asCharString(&local_d0);
    local_dc = RobbingQuad;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count((set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *)
          &r.wining_hand.last_tile,&local_dc);
    StringFrom(in_stack_fffffffffffffe48);
    uVar7 = (undefined4)(in_stack_fffffffffffffe48 >> 0x20);
    pcVar5 = SimpleString::asCharString(&local_d8);
    local_e8.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_e8);
    uVar6 = CONCAT44(uVar7,0xad);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,uVar6,&local_e8);
    value = (int)((ulong)uVar6 >> 0x20);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e04f2);
    SimpleString::~SimpleString((SimpleString *)0x1e04fe);
    SimpleString::~SimpleString((SimpleString *)0x1e050a);
  }
  if (r.patterns._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ == 1) {
    pUVar3 = UtestShell::getCurrent();
    local_110.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_110);
    (*pUVar3->_vptr_UtestShell[0xe])
              (pUVar3,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,0xae,&local_110);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e080b);
  }
  else {
    pUVar3 = UtestShell::getCurrent();
    StringFrom(value);
    pcVar4 = SimpleString::asCharString(&local_f8);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_100);
    local_108.super_TestTerminator._vptr_TestTerminator = (TestTerminator)(_func_int **)0x0;
    NormalTestTerminator::NormalTestTerminator(&local_108);
    (*pUVar3->_vptr_UtestShell[0x16])
              (pUVar3,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/winingstate_test.cpp"
               ,CONCAT44(value,0xae),&local_108);
    NormalTestTerminator::~NormalTestTerminator((NormalTestTerminator *)0x1e071f);
    SimpleString::~SimpleString((SimpleString *)0x1e072b);
    SimpleString::~SimpleString((SimpleString *)0x1e0737);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport((DoublingFactorReport *)local_a8);
  return;
}

Assistant:

TEST(WiningStateTest, RobbingQuad)
{
	addNoWiningHand();

	WinByDiscardSituation situation;
	situation.is_robbing_quad = true;

	winByDiscard(situation);
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::RobbingQuad));
	CHECK_EQUAL(1, r.doubling_factor);
}